

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupportTest_setDataForUnsignedIntegerValues_Test::testBody
          (TEST_MockSupportTest_setDataForUnsignedIntegerValues_Test *this)

{
  uint uVar1;
  MockSupport *pMVar2;
  UtestShell *pUVar3;
  ulong uVar4;
  TestTerminator *pTVar5;
  SimpleString local_b8;
  SimpleString local_a8;
  MockNamedValue local_98;
  SimpleString local_48 [2];
  SimpleString local_28;
  uint local_14;
  TEST_MockSupportTest_setDataForUnsignedIntegerValues_Test *pTStack_10;
  uint expected_data;
  TEST_MockSupportTest_setDataForUnsignedIntegerValues_Test *this_local;
  
  local_14 = 7;
  pTStack_10 = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"data");
  MockSupport::setData(pMVar2,local_48,local_14);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  pUVar3 = UtestShell::getCurrent();
  uVar4 = (ulong)local_14;
  SimpleString::SimpleString(&local_a8,"");
  pMVar2 = mock(&local_a8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"data");
  MockSupport::getData(&local_98,pMVar2,&local_b8);
  uVar1 = MockNamedValue::getUnsignedIntValue(&local_98);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,uVar4,(ulong)uVar1,
             "LONGS_EQUAL(expected_data, mock().getData(\"data\").getUnsignedIntValue()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x35,pTVar5);
  MockNamedValue::~MockNamedValue(&local_98);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString(&local_a8);
  return;
}

Assistant:

TEST(MockSupportTest, setDataForUnsignedIntegerValues)
{
    unsigned int expected_data = 7;
    mock().setData("data", expected_data);
    LONGS_EQUAL(expected_data, mock().getData("data").getUnsignedIntValue());
}